

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int16_t envy_bios_parse_power_fan_calib_model
                  (envy_bios_power_fan_calib_entry *e,uint8_t fan_speed,int16_t *div)

{
  short sVar1;
  short sVar2;
  int16_t val;
  int16_t low;
  int16_t high;
  int16_t duty_offset;
  int16_t duty_max;
  int16_t *div_local;
  uint8_t fan_speed_local;
  envy_bios_power_fan_calib_entry *e_local;
  
  *div = (int16_t)(0x149970 / (ulong)(long)(int)(uint)e->pwm_freq);
  sVar1 = (short)(((int)*div * (int)e->duty_offset) / 0x1000);
  sVar2 = (short)((int)((int)*div * (uint)e->duty_max) / 0x1000) + sVar1;
  if ((sVar2 < 0) || (sVar2 < sVar1)) {
    e_local._6_2_ = *div;
  }
  else {
    e_local._6_2_ = sVar1 + (short)((int)((uint)fan_speed * ((int)sVar2 - (int)sVar1)) / 100);
    sVar1 = e_local._6_2_;
    if (*div <= e_local._6_2_) {
      sVar1 = *div;
    }
    if (sVar1 < 0) {
      e_local._6_2_ = 0;
    }
    else if (*div <= e_local._6_2_) {
      e_local._6_2_ = *div;
    }
  }
  return e_local._6_2_;
}

Assistant:

static int16_t
envy_bios_parse_power_fan_calib_model(struct envy_bios_power_fan_calib_entry *e,
                                      uint8_t fan_speed, int16_t *div) {
	int16_t duty_max, duty_offset, high, low, val;

	*div = 1350000 / e->pwm_freq;
	duty_max = *div * e->duty_max / 4096;
	duty_offset = *div * e->duty_offset / 4096;

	/* TODO: Figure out a better algorithm than this one:
	 * def low_model(pwm_freq, duty_offset):
	 *     div = int(13.5e5 / pwm_freq)
	 *     offset = round(div / 2.4889, 0)
	 *     period = math.floor(pwm_freq * 205 / 65536) - 1
	 *     slope = div / 4096
	 *
	 *     if duty_offset == 0:
	 *         return 0
	 *
	 *     o = 0
	 *     if (duty_offset % period) < period / 2.0:
	 *         o = offset
	 *     else:
	 *         o = 1
	 *
	 *     return min(int(duty_offset * slope + o), div)
	 */
	low = duty_offset;

	/* TODO: Figure out the reason for all these off-by-one that can go either
	 * way...
	 */
	high = duty_max + duty_offset;
	if (high < 0 || low > high)
		return *div;

	/* do a linear interpolation between low and high to get the duty cycle
	 * corresponding to the wanted fan speed
	 */
	val = low + fan_speed * (high - low) / 100;

	return MAX(0, MIN(val, *div));
}